

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::DynamicRectMatrix<double>::getSubMatrix<OpenMD::SquareMatrix3<double>>
          (DynamicRectMatrix<double> *this,uint beginRow,uint beginCol,SquareMatrix3<double> *m)

{
  double **ppdVar1;
  double *pdVar2;
  long lVar3;
  uint j;
  long lVar4;
  
  ppdVar1 = this->data_;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pdVar2 = ppdVar1[(int)lVar3 + beginRow];
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      (((SquareMatrix<double,_3> *)*(double (*) [3])m)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar4] = pdVar2[beginCol + (int)lVar4];
    }
    m = (SquareMatrix3<double> *)((long)m + 0x18);
  }
  return;
}

Assistant:

void getSubMatrix(unsigned int beginRow, unsigned int beginCol,
                      MatrixType& m) {
      assert(beginRow + m.getNRow() - 1 <= nrow_);
      assert(beginCol + m.getNCol() - 1 <= ncol_);

      for (unsigned int i = 0; i < m.getNRow(); ++i)
        for (unsigned int j = 0; j < m.getNCol(); ++j)
          m(i, j) = this->data_[beginRow + i][beginCol + j];
    }